

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O1

char * __thiscall io::LineReader::next_line(LineReader *this)

{
  long lVar1;
  _Head_base<0UL,_char_*,_false> _Var2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  undefined8 *puVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  line_length_limit_exceeded err;
  
  iVar3 = this->data_begin;
  iVar7 = this->data_end;
  if (iVar3 == iVar7) {
    pcVar5 = (char *)0x0;
  }
  else {
    this->file_line = this->file_line + 1;
    if (iVar7 <= iVar3) {
      __assert_fail("data_begin < data_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Joeppie[P]Backproject/thirdparty/fast-cpp-csv-parser/csv.h"
                    ,0x1ba,"char *io::LineReader::next_line()");
    }
    if (0x2000000 < iVar7) {
      __assert_fail("data_end <= block_len*2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Joeppie[P]Backproject/thirdparty/fast-cpp-csv-parser/csv.h"
                    ,0x1bb,"char *io::LineReader::next_line()");
    }
    if (0xffffff < iVar3) {
      _Var2._M_head_impl =
           (this->buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      memcpy(_Var2._M_head_impl,_Var2._M_head_impl + 0x1000000,0x1000000);
      this->data_begin = this->data_begin + -0x1000000;
      this->data_end = this->data_end + -0x1000000;
      if ((this->reader).byte_source._M_t.
          super___uniq_ptr_impl<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_>._M_t.
          super__Tuple_impl<0UL,_io::ByteSourceBase_*,_std::default_delete<io::ByteSourceBase>_>.
          super__Head_base<0UL,_io::ByteSourceBase_*,_false>._M_head_impl != (ByteSourceBase *)0x0)
      {
        iVar3 = detail::AsynchronousReader::finish_read(&this->reader);
        this->data_end = this->data_end + iVar3;
        _Var2._M_head_impl =
             (this->buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
        memcpy(_Var2._M_head_impl + 0x1000000,_Var2._M_head_impl + 0x2000000,0x1000000);
        detail::AsynchronousReader::start_read
                  (&this->reader,
                   (this->buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                   _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x2000000,0x1000000);
      }
    }
    iVar3 = this->data_begin;
    lVar9 = (long)iVar3;
    lVar4 = (lVar9 << 0x20) + -0x100000000;
    pcVar5 = (this->buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl + lVar9;
    lVar10 = 0;
    do {
      pcVar8 = pcVar5;
      lVar4 = lVar4 + 0x100000000;
      lVar1 = lVar10 + -1;
      if (*pcVar8 == '\n') break;
      bVar11 = lVar9 - this->data_end != lVar10;
      pcVar5 = pcVar8 + 1;
      lVar10 = lVar1;
    } while (bVar11);
    iVar7 = (int)lVar1;
    if (iVar7 < -0x1000000) {
      pcVar5 = err.super_base.error_message_buffer + 0xf8;
      memset(pcVar5,0,0x100);
      err.super_with_file_name.file_name[0xf8] = -1;
      err.super_with_file_name.file_name[0xf9] = -1;
      err.super_with_file_name.file_name[0xfa] = -1;
      err.super_with_file_name.file_name[0xfb] = -1;
      strncpy(pcVar5,this->file_name,0xff);
      err.super_with_file_name.file_name[0xf7] = '\0';
      err.super_with_file_name.file_name._248_4_ = this->file_line;
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x210);
      *puVar6 = &PTR__exception_001206e0;
      memcpy(puVar6 + 1,&err,0x100);
      memcpy(puVar6 + 0x21,pcVar5,0x100);
      *(undefined4 *)(puVar6 + 0x41) = err.super_with_file_name.file_name._248_4_;
      *puVar6 = &PTR__exception_001207f0;
      __cxa_throw(puVar6,&error::line_length_limit_exceeded::typeinfo,std::exception::~exception);
    }
    if (*pcVar8 != '\n') {
      this->data_end = this->data_end + 1;
    }
    *pcVar8 = '\0';
    if (~this->data_begin + iVar3 != iVar7) {
      _Var2._M_head_impl =
           (this->buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      if (_Var2._M_head_impl[(lVar4 >> 0x20) + -1] == '\r') {
        _Var2._M_head_impl[(lVar4 >> 0x20) + -1] = '\0';
      }
    }
    pcVar5 = (this->buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl + this->data_begin;
    this->data_begin = iVar3 - iVar7;
  }
  return pcVar5;
}

Assistant:

char*next_line(){
                        if(data_begin == data_end)
                                return 0;

                        ++file_line;

                        assert(data_begin < data_end);
                        assert(data_end <= block_len*2);

                        if(data_begin >= block_len){
                                std::memcpy(buffer.get(), buffer.get()+block_len, block_len);
                                data_begin -= block_len;
                                data_end -= block_len;
                                if(reader.is_valid())
                                {
                                        data_end += reader.finish_read();
                                        std::memcpy(buffer.get()+block_len, buffer.get()+2*block_len, block_len);
                                        reader.start_read(buffer.get() + 2*block_len, block_len);
                                }
                        }

                        int line_end = data_begin;
                        while(buffer[line_end] != '\n' && line_end != data_end){
                                ++line_end;
                        }

                        if(line_end - data_begin + 1 > block_len){
                                error::line_length_limit_exceeded err;
                                err.set_file_name(file_name);
                                err.set_file_line(file_line);
                                throw err;
                        }

                        if(buffer[line_end] == '\n'){
                                buffer[line_end] = '\0';
                        }else{
                                // some files are missing the newline at the end of the
                                // last line
                                ++data_end;
                                buffer[line_end] = '\0';
                        }

                        // handle windows \r\n-line breaks
                        if(line_end != data_begin && buffer[line_end-1] == '\r')
                                buffer[line_end-1] = '\0';

                        char*ret = buffer.get() + data_begin;
                        data_begin = line_end+1;
                        return ret;
                }